

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime.c
# Opt level: O0

void * helper_lookup_tb_ptr_sparc64(CPUArchState_conflict17 *env)

{
  uc_struct_conflict7 *puVar1;
  uint32_t cf_mask;
  CPUState *cpu_00;
  TranslationBlock *pTVar2;
  uc_struct_conflict9 *uc;
  uint32_t flags;
  target_ulong pc;
  target_ulong cs_base;
  TranslationBlock *tb;
  CPUState *cpu;
  CPUArchState_conflict17 *env_local;
  
  cpu = (CPUState *)env;
  cpu_00 = env_cpu(env);
  puVar1 = cpu_00->uc;
  tb = (TranslationBlock *)cpu_00;
  cf_mask = curr_cflags();
  pTVar2 = tb_lookup__cpu_state
                     (cpu_00,(target_ulong *)&stack0xffffffffffffffc8,&pc,
                      (uint32_t *)((long)&uc + 4),cf_mask);
  if (pTVar2 == (TranslationBlock *)0x0) {
    env_local = (CPUArchState_conflict17 *)puVar1->tcg_ctx->code_gen_epilogue;
  }
  else {
    env_local = (CPUArchState_conflict17 *)(pTVar2->tc).ptr;
  }
  return env_local;
}

Assistant:

void *HELPER(lookup_tb_ptr)(CPUArchState *env)
{
    CPUState *cpu = env_cpu(env);
    TranslationBlock *tb;
    target_ulong cs_base, pc;
    uint32_t flags;
    struct uc_struct *uc = (struct uc_struct *)cpu->uc;

    tb = tb_lookup__cpu_state(cpu, &pc, &cs_base, &flags, curr_cflags());
    if (tb == NULL) {
        return uc->tcg_ctx->code_gen_epilogue;
    }
    return tb->tc.ptr;
}